

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

void __thiscall
testing::internal::ElementsAreMatcherImpl<std::vector<char,std::allocator<char>>const&>::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<testing::Matcher<char_const&>*,std::vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>>>
          (ElementsAreMatcherImpl<std::vector<char,std::allocator<char>>const&> *this,
          __normal_iterator<testing::Matcher<const_char_&>_*,_std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
          first,__normal_iterator<testing::Matcher<const_char_&>_*,_std::vector<testing::Matcher<const_char_&>,_std::allocator<testing::Matcher<const_char_&>_>_>_>
                last)

{
  MatcherBase<const_char_&> local_40;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_00270cc8;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  if (first._M_current != last._M_current) {
    do {
      local_40.vtable_ = ((first._M_current)->super_MatcherBase<const_char_&>).vtable_;
      local_40.buffer_ =
           (Buffer)((first._M_current)->super_MatcherBase<const_char_&>).buffer_.shared;
      if ((local_40.vtable_ != (VTable *)0x0) &&
         ((local_40.vtable_)->shared_destroy != (_func_void_SharedPayloadBase_ptr *)0x0)) {
        LOCK();
        ((local_40.buffer_.shared)->ref).super___atomic_base<int>._M_i =
             ((local_40.buffer_.shared)->ref).super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_40.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)&PTR__MatcherBase_00269b70;
      std::vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>::
      emplace_back<testing::Matcher<char_const&>>
                ((vector<testing::Matcher<char_const&>,std::allocator<testing::Matcher<char_const&>>>
                  *)(this + 8),(Matcher<const_char_&> *)&local_40);
      first._M_current = first._M_current + 1;
      MatcherBase<const_char_&>::~MatcherBase(&local_40);
    } while (first._M_current != last._M_current);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }